

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode findprotocol(Curl_easy *data,connectdata *conn,char *protostr)

{
  Curl_handler *pCVar1;
  int iVar2;
  Curl_handler *p;
  Curl_handler **pp;
  char *protostr_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  p = (Curl_handler *)protocols;
  do {
    pCVar1 = (Curl_handler *)p->scheme;
    if (pCVar1 == (Curl_handler *)0x0) {
LAB_00129bbc:
      Curl_failf(data,"Protocol \"%s\" not supported or disabled in libcurl",protostr);
      return CURLE_UNSUPPORTED_PROTOCOL;
    }
    iVar2 = Curl_strcasecompare(pCVar1->scheme,protostr);
    if (iVar2 != 0) {
      if ((((data->set).allowed_protocols & (ulong)pCVar1->protocol) != 0) &&
         ((((data->state).this_is_a_follow & 1U) == 0 ||
          (((data->set).redir_protocols & (ulong)pCVar1->protocol) != 0)))) {
        conn->given = pCVar1;
        conn->handler = pCVar1;
        return CURLE_OK;
      }
      goto LAB_00129bbc;
    }
    p = (Curl_handler *)&p->setup_connection;
  } while( true );
}

Assistant:

static CURLcode findprotocol(struct Curl_easy *data,
                             struct connectdata *conn,
                             const char *protostr)
{
  const struct Curl_handler * const *pp;
  const struct Curl_handler *p;

  /* Scan protocol handler table and match against 'protostr' to set a few
     variables based on the URL. Now that the handler may be changed later
     when the protocol specific setup function is called. */
  for(pp = protocols; (p = *pp) != NULL; pp++) {
    if(strcasecompare(p->scheme, protostr)) {
      /* Protocol found in table. Check if allowed */
      if(!(data->set.allowed_protocols & p->protocol))
        /* nope, get out */
        break;

      /* it is allowed for "normal" request, now do an extra check if this is
         the result of a redirect */
      if(data->state.this_is_a_follow &&
         !(data->set.redir_protocols & p->protocol))
        /* nope, get out */
        break;

      /* Perform setup complement if some. */
      conn->handler = conn->given = p;

      /* 'port' and 'remote_port' are set in setup_connection_internals() */
      return CURLE_OK;
    }
  }


  /* The protocol was not found in the table, but we don't have to assign it
     to anything since it is already assigned to a dummy-struct in the
     create_conn() function when the connectdata struct is allocated. */
  failf(data, "Protocol \"%s\" not supported or disabled in " LIBCURL_NAME,
        protostr);

  return CURLE_UNSUPPORTED_PROTOCOL;
}